

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassTemplate.h
# Opt level: O3

void __thiscall
kiste::ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
render_footer<kiste::class_t>
          (ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,size_t line_no
          ,class_t *class_data)

{
  line_directive(this,line_no);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"\n};\n\nstruct ",0xc);
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"_generator\n{\n  ",0xf);
  line_directive(this,line_no);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,
             "\n  template<typename DATA_T, typename SERIALIZER_T>\n  auto operator()(const DATA_T& data, SERIALIZER_T& serialize) const\n    -> "
             ,0x80);
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,
             "_t<kiste::terminal_t, DATA_T, SERIALIZER_T>\n  {\n    return {kiste::terminal, data, serialize};\n  }\n};\nconstexpr auto "
             ,0x75);
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os," = ",3);
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"_generator{};\n\n",0xf);
  line_directive(this,line_no);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"\n",1);
  return;
}

Assistant:

void render_footer(const size_t line_no, const ClassData& class_data)
    {
    static_assert(std::is_same<decltype(line_directive(line_no)), void>::value, "$call{} requires void expression"); (line_directive(line_no));_serialize.text("\n"
                    "};\n"
                    "\n"
                    "struct ");_serialize.escape(class_data._name);_serialize.text("_generator\n"
                    "{\n"
                    "  ");static_assert(std::is_same<decltype(line_directive(line_no)), void>::value, "$call{} requires void expression"); (line_directive(line_no));_serialize.text("\n"
                    "  template<typename DATA_T, typename SERIALIZER_T>\n"
                    "  auto operator()(const DATA_T& data, SERIALIZER_T& serialize) const\n"
                    "    -> ");_serialize.escape(class_data._name);_serialize.text("_t<kiste::terminal_t, DATA_T, SERIALIZER_T>\n"
                    "  {\n"
                    "    return {kiste::terminal, data, serialize};\n"
                    "  }\n"
                    "};\n"
                    "constexpr auto ");_serialize.escape(class_data._name);_serialize.text(" = ");_serialize.escape(class_data._name);_serialize.text("_generator{};\n"
                    "\n");
    static_assert(std::is_same<decltype(line_directive(line_no)), void>::value, "$call{} requires void expression"); (line_directive(line_no));_serialize.text("\n");
    }